

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O1

ex_ex * eval_func(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  t_float *ptVar1;
  long *plVar2;
  ex_ex *eptr_00;
  ex_ex *peVar3;
  long lVar4;
  long lVar5;
  ex_ex args [10];
  long lStack_138;
  ex_ex *local_130;
  ex_ex local_128 [10];
  
  ptVar1 = (eptr->ex_cont).v_vec;
  if ((ptVar1 == (t_float *)0x0) || (*(long *)ptVar1 == 0)) {
    eptr_00 = (ex_ex *)0x0;
  }
  else if (*(long *)(ptVar1 + 4) < 0xb) {
    eptr_00 = eptr + 1;
    lVar5 = *(long *)(ptVar1 + 4);
    if (*(code **)(ptVar1 + 2) == ex_if) {
      if (0 < lVar5) {
        peVar3 = local_128;
        lVar5 = 0;
        do {
          lVar5 = lVar5 + 1;
          (peVar3->ex_cont).v_int = 0;
          peVar3->ex_type = 0;
          peVar3 = peVar3 + 1;
        } while (lVar5 < *(long *)(ptVar1 + 4));
      }
      eptr_00 = ex_if(expr,eptr_00,optr,local_128,idx);
    }
    else {
      local_130 = optr;
      if (0 < lVar5) {
        peVar3 = local_128;
        lVar4 = 0;
        do {
          (peVar3->ex_cont).v_int = 0;
          peVar3->ex_type = 0;
          eptr_00 = ex_eval(expr,eptr_00,peVar3,idx);
          lVar4 = lVar4 + 1;
          lVar5 = *(long *)(ptVar1 + 4);
          peVar3 = peVar3 + 1;
        } while (lVar4 < lVar5);
      }
      (**(code **)(ptVar1 + 2))(expr,lVar5,local_128,local_130);
    }
    if (0 < *(long *)(ptVar1 + 4)) {
      lVar5 = 0;
      plVar2 = &lStack_138;
      do {
        if (plVar2[3] == 0xf) {
          free((void *)plVar2[2]);
        }
        lVar5 = lVar5 + 1;
        plVar2 = plVar2 + 3;
      } while (lVar5 < *(long *)(ptVar1 + 4));
    }
  }
  else {
    eptr_00 = (ex_ex *)0x0;
    pd_error(expr,"expr: eval_func: asking too many arguments\n");
  }
  return eptr_00;
}

Assistant:

struct ex_ex *
eval_func(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
{
        int i;
        struct ex_ex args[MAX_ARGS];
        t_ex_func *f;

        f = (t_ex_func *)(eptr++)->ex_ptr;
        if (!f || !f->f_name) {
                return (exNULL);
        }
        if (f->f_argc > MAX_ARGS) {
                post_error((fts_object_t *) expr, "expr: eval_func: asking too many arguments\n");
                return (exNULL);
        }

                /*
                 * We treat the "if" function differently to be able to evaluate
                 * the args selectively based on the truth value of the "condition"
                 */
                if (f->f_func != (void (*)) ex_if) {
                        for (i = 0; i < f->f_argc; i++) {
                args[i].ex_type = 0;
                args[i].ex_int = 0;
                eptr = ex_eval(expr, eptr, &args[i], idx);
                        }
                (*f->f_func)(expr, f->f_argc, args, optr);
        } else {
                        for (i = 0; i < f->f_argc; i++) {
                args[i].ex_type = 0;
                args[i].ex_int = 0;
                        }
                eptr = ex_if(expr, eptr, optr, args, idx);
                }
        for (i = 0; i < f->f_argc; i++) {
                if (args[i].ex_type == ET_VEC)
                        fts_free(args[i].ex_vec);
        }
        return (eptr);
}